

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O0

void __thiscall bsplib::A2A::~A2A(A2A *this)

{
  A2A *this_local;
  
  if (this->m_recv_win != (MPI_Win)&ompi_mpi_win_null) {
    MPI_Win_free(&this->m_recv_win);
  }
  MPI_Comm_free(&this->m_comm);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_ready);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~vector(&this->m_reqs);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_small_recv_buf);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_small_send_buf);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_recv_bufs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_recv_pos);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_recv_sizes);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_send_bufs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_send_pos);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_send_sizes);
  LinCost::~LinCost(&this->m_lincost);
  return;
}

Assistant:

A2A::~A2A()
{
    if ( m_recv_win != MPI_WIN_NULL )
        MPI_Win_free( &m_recv_win );

    MPI_Comm_free( &m_comm );
    m_comm = MPI_COMM_NULL;
}